

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void address_space_dispatch_free_aarch64(AddressSpaceDispatch *d)

{
  MemoryRegion *mem;
  uint uVar1;
  
  uVar1 = (d->map).sections_nb;
  while (uVar1 != 0) {
    (d->map).sections_nb = uVar1 - 1;
    mem = (d->map).sections[uVar1 - 1].mr;
    if (mem->subpage == true) {
      g_free(mem);
    }
    uVar1 = (d->map).sections_nb;
  }
  g_free((d->map).sections);
  g_free((d->map).nodes);
  g_free(d);
  return;
}

Assistant:

void address_space_dispatch_free(AddressSpaceDispatch *d)
{
    phys_sections_free(&d->map);
    g_free(d);
}